

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

bool __thiscall cfd::core::KeyFormatData::IsFindVersion(KeyFormatData *this,uint32_t version)

{
  initializer_list<const_cfd::core::ExtkeyVersionPair_*> __l;
  const_reference cVar1;
  reference ppEVar2;
  Bip32FormatType *type;
  Bip32FormatType *__end2;
  Bip32FormatType *__begin2;
  Bip32FormatType (*__range2) [3];
  allocator<const_cfd::core::ExtkeyVersionPair_*> local_61;
  ExtkeyVersionPair *local_60;
  ExtkeyVersionPair *local_58;
  ExtkeyVersionPair *local_50;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  cache_list;
  uint32_t version_local;
  KeyFormatData *this_local;
  
  local_60 = &this->bip32_;
  local_58 = &this->bip49_;
  local_50 = &this->bip84_;
  local_48 = &local_60;
  local_40 = 3;
  cache_list.
  super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = version;
  ::std::allocator<const_cfd::core::ExtkeyVersionPair_*>::allocator(&local_61);
  __l._M_len = local_40;
  __l._M_array = local_48;
  ::std::
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::vector((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
            *)local_38,__l,&local_61);
  ::std::allocator<const_cfd::core::ExtkeyVersionPair_*>::~allocator(&local_61);
  __end2 = &kFormatTypeList;
  do {
    if (__end2 == (Bip32FormatType *)&LoadCache()::func) {
      this_local._7_1_ = false;
LAB_0046e04f:
      ::std::
      vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
      ::~vector((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                 *)local_38);
      return this_local._7_1_;
    }
    cVar1 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->has_format_,(ulong)*__end2);
    if ((cVar1) &&
       ((ppEVar2 = ::std::
                   vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                   ::operator[]((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                                 *)local_38,(ulong)*__end2),
        (*ppEVar2)->pubkey_version ==
        cache_list.
        super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ||
        (ppEVar2 = ::std::
                   vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                   ::operator[]((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                                 *)local_38,(ulong)*__end2),
        (*ppEVar2)->privkey_version ==
        cache_list.
        super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)))) {
      this_local._7_1_ = true;
      goto LAB_0046e04f;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

bool KeyFormatData::IsFindVersion(uint32_t version) const {
  std::vector<const ExtkeyVersionPair *> cache_list = {
      &bip32_, &bip49_, &bip84_};
  for (const auto &type : kFormatTypeList) {
    if (has_format_[type]) {
      if ((cache_list[type]->pubkey_version == version) ||
          (cache_list[type]->privkey_version == version)) {
        return true;
      }
    }
  }
  return false;
}